

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeKeyRoomAction.cpp
# Opt level: O2

bool __thiscall ThreeKeyRoomAction::hasAKey(ThreeKeyRoomAction *this)

{
  itemLocation iVar1;
  ItemWrapper *pIVar2;
  bool bVar3;
  itemType local_1c [3];
  
  local_1c[2] = 0xf;
  pIVar2 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_1c + 2);
  iVar1 = ItemWrapper::getLocation(pIVar2);
  bVar3 = true;
  if (iVar1 != BACKPACK) {
    local_1c[1] = 0x10;
    pIVar2 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_1c + 1);
    iVar1 = ItemWrapper::getLocation(pIVar2);
    if (iVar1 != BACKPACK) {
      local_1c[0] = BLUE_KEY;
      pIVar2 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_1c);
      iVar1 = ItemWrapper::getLocation(pIVar2);
      bVar3 = iVar1 == BACKPACK;
    }
  }
  return bVar3;
}

Assistant:

bool ThreeKeyRoomAction::hasAKey() const {
    return !(itemList->getValue(GREEN_KEY)->getLocation() != BACKPACK
           && itemList->getValue(WHITE_KEY)->getLocation() != BACKPACK
           && itemList->getValue(BLUE_KEY)->getLocation() != BACKPACK);
}